

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O2

int stbtt_GetFontOffsetForIndex(uchar *data,int index)

{
  int iVar1;
  stbtt_uint32 sVar2;
  stbtt_int32 sVar3;
  
  iVar1 = stbtt__isfont(data);
  if (iVar1 == 0) {
    iVar1 = -1;
    if ((((*data == 't') && (data[1] == 't')) && (data[2] == 'c')) && (data[3] == 'f')) {
      sVar2 = ttULONG(data + 4);
      if ((sVar2 == 0x20000) || (sVar2 == 0x10000)) {
        sVar3 = ttLONG(data + 8);
        if (index < sVar3) {
          sVar2 = ttULONG(data + (long)(index << 2) + 0xc);
          return sVar2;
        }
      }
    }
  }
  else {
    iVar1 = -(uint)(index != 0);
  }
  return iVar1;
}

Assistant:

STBTT_DEF int stbtt_GetFontOffsetForIndex(const unsigned char *data, int index)
{
   return stbtt_GetFontOffsetForIndex_internal((unsigned char *) data, index);
}